

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O2

DArray<int> *
Kernel::PrecedenceOrdering::predLevelsFromOptsAndPrec
          (DArray<int> *__return_storage_ptr__,Problem *prb,Options *opt,
          DArray<int> *predicatePrecedences)

{
  LiteralComparisonMode LVar1;
  PredicateSineLevels PVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  byte bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  ulong in_RAX;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint local_38;
  uint level;
  
  uVar13 = (ulong)(*(long *)(DAT_00a14190 + 0x88) - *(long *)(DAT_00a14190 + 0x80)) >> 3;
  _local_38 = in_RAX;
  Lib::DArray<int>::DArray(__return_storage_ptr__,(size_t)(uVar13 & 0xffffffff));
  LVar1 = (opt->_literalComparisonMode).super_OptionValue<Shell::Options::LiteralComparisonMode>.
          actualValue;
  if (LVar1 < STANDARD) {
    piVar3 = predicatePrecedences->_array;
    piVar4 = __return_storage_ptr__->_array;
    for (uVar10 = 1; uVar10 < (uVar13 & 0xffffffff); uVar10 = uVar10 + 1) {
      piVar4[uVar10] = piVar3[uVar10] + 1;
    }
  }
  else if (LVar1 == STANDARD) {
    Lib::DArray<int>::init(__return_storage_ptr__,(EVP_PKEY_CTX *)(uVar13 & 0xffffffff));
  }
  *__return_storage_ptr__->_array = 0;
  bVar6 = DAT_00a141a8;
  if (DAT_00a141b0 != (DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0)
  {
    uVar12 = (uint)DAT_00a141a8;
    PVar2 = (opt->_sineToPredLevels).super_OptionValue<Shell::Options::PredicateSineLevels>.
            actualValue;
    uVar9 = 1;
    while( true ) {
      _local_38 = CONCAT44(level,uVar9);
      if ((uint)uVar13 <= uVar9) break;
      bVar7 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                        (DAT_00a141b0,&stack0xffffffffffffffc8,&level);
      uVar9 = uVar12;
      if (bVar7) {
        uVar9 = level;
      }
      uVar8 = bVar6 - uVar9;
      if (PVar2 != ON) {
        uVar8 = uVar9;
      }
      __return_storage_ptr__->_array[_local_38 & 0xffffffff] = uVar8 + 1;
      uVar9 = local_38 + 1;
    }
  }
  lVar5 = DAT_00a14190;
  piVar3 = __return_storage_ptr__->_array;
  for (uVar10 = 1; uVar10 < (uVar13 & 0xffffffff); uVar10 = uVar10 + 1) {
    uVar9 = *(uint *)(*(long *)(*(long *)(lVar5 + 0x80) + uVar10 * 8) + 0x40);
    iVar11 = -1;
    if (((uVar9 & 0x20) != 0) || (iVar11 = (uint)uVar13 + 2, (uVar9 & 0x40) != 0)) {
      piVar3[uVar10] = iVar11;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DArray<int> PrecedenceOrdering::predLevelsFromOptsAndPrec(Problem& prb, const Options& opt, const DArray<int>& predicatePrecedences) {
  unsigned nPredicates = env.signature->predicates();

  DArray<int> predicateLevels(nPredicates);

  switch(opt.literalComparisonMode()) {
  case Shell::Options::LiteralComparisonMode::STANDARD:
    predicateLevels.init(nPredicates, PredLevels::MIN_USER_DEF);
    break;
  case Shell::Options::LiteralComparisonMode::PREDICATE:
  case Shell::Options::LiteralComparisonMode::REVERSE:
    for(unsigned i=1;i<nPredicates;i++) {
      predicateLevels[i] = predicatePrecedences[i] + PredLevels::MIN_USER_DEF;
    }
    break;
  }
  //equality is on the lowest level
  predicateLevels[0] = PredLevels::EQ;

  if (env.predicateSineLevels) {
    // predicateSineLevels start from zero
    unsigned bound = env.maxSineLevel; // this is at least as large as the maximal value of a predicateSineLevel
    bool reverse = (opt.sineToPredLevels() == Options::PredicateSineLevels::ON); // the ON, i.e. reasonable, version wants low sine levels mapping to high predicateLevels

    for(unsigned i=1;i<nPredicates;i++) { // starting from 1, keeping predicateLevels[0]=0;
      unsigned level;
      if (!env.predicateSineLevels->find(i,level)) {
        level = bound;
      }
      predicateLevels[i] = (reverse ? (bound - level) : level) + PredLevels::MIN_USER_DEF;
      // cout << "setting predicate level of " << env.signature->predicateName(i) << " to " << predicateLevels[i] << endl;
    }
  }

  for(unsigned i=1;i<nPredicates;i++) {
    Signature::Symbol* predSym = env.signature->getPredicate(i);
    //consequence-finding name predicates have the lowest level
    if(predSym->label()) {
      predicateLevels[i]=-1;
    }
    else if(predSym->equalityProxy()) {
      //equality proxy predicates have the highest level (lower than colored predicates)
      predicateLevels[i] = nPredicates + PredLevels::MIN_USER_DEF+ 1;
    }
  }

  checkLevelAssumptions(predicateLevels);
  return predicateLevels;
}